

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

StorageClass __thiscall
spvtools::opt::ConvertToSampledImagePass::GetStorageClass
          (ConvertToSampledImagePass *this,Instruction *variable)

{
  Op OVar1;
  uint32_t id;
  int iVar2;
  IRContext *this_00;
  TypeManager *this_01;
  Type *pTVar3;
  undefined4 extraout_var;
  Pointer *pointer_type;
  Type *type;
  Instruction *variable_local;
  ConvertToSampledImagePass *this_local;
  
  OVar1 = Instruction::opcode(variable);
  if (OVar1 == OpVariable) {
    this_00 = Pass::context(&this->super_Pass);
    this_01 = IRContext::get_type_mgr(this_00);
    id = Instruction::type_id(variable);
    pTVar3 = analysis::TypeManager::GetType(this_01,id);
    iVar2 = (*pTVar3->_vptr_Type[0x1f])();
    if ((Pointer *)CONCAT44(extraout_var,iVar2) == (Pointer *)0x0) {
      this_local._4_4_ = Max;
    }
    else {
      this_local._4_4_ = analysis::Pointer::storage_class((Pointer *)CONCAT44(extraout_var,iVar2));
    }
    return this_local._4_4_;
  }
  __assert_fail("variable.opcode() == spv::Op::OpVariable",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/convert_to_sampled_image_pass.cpp"
                ,0x81,
                "spv::StorageClass spvtools::opt::ConvertToSampledImagePass::GetStorageClass(const Instruction &) const"
               );
}

Assistant:

spv::StorageClass ConvertToSampledImagePass::GetStorageClass(
    const Instruction& variable) const {
  assert(variable.opcode() == spv::Op::OpVariable);
  auto* type = context()->get_type_mgr()->GetType(variable.type_id());
  auto* pointer_type = type->AsPointer();
  if (!pointer_type) return spv::StorageClass::Max;

  return pointer_type->storage_class();
}